

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::EytzingerLayoutSorter::Sort
          (EytzingerLayoutSorter *this,size_t output_index)

{
  ulong uVar1;
  ulong uVar2;
  
  if (output_index < (this->input).len_) {
    do {
      Sort(this,output_index * 2 + 1);
      uVar1 = (this->input).len_;
      uVar2 = this->i;
      this->i = uVar2 + 1;
      if (uVar1 <= uVar2) {
        Sort();
LAB_002950d9:
        Sort();
      }
      if ((this->output).len_ <= output_index) goto LAB_002950d9;
      (this->output).ptr_[output_index] = (this->input).ptr_[uVar2];
      output_index = output_index * 2 + 2;
    } while (output_index < uVar1);
  }
  return;
}

Assistant:

void Sort(size_t output_index = 0) {
    if (output_index < input.size()) {
      Sort(2 * output_index + 1);
      output[output_index] = input[i++];
      Sort(2 * output_index + 2);
    }
  }